

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O3

int enet_protocol_handle_send_unreliable_fragment
              (ENetHost *host,ENetPeer *peer,ENetProtocol *command,enet_uint8 **currentData)

{
  uint *puVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  ushort uVar6;
  enet_uint8 *peVar7;
  ENetIncomingCommand *pEVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ENetChannel *channel;
  
  iVar11 = -1;
  if (((ulong)(command->header).channelID < peer->channelCount) &&
     (peer->state - ENET_PEER_STATE_CONNECTED < 2)) {
    uVar2 = (command->acknowledge).receivedSentTime;
    uVar6 = uVar2 << 8 | uVar2 >> 8;
    peVar7 = *currentData + uVar6;
    *currentData = peVar7;
    if ((uVar2 != 0) &&
       ((((ulong)uVar6 <= host->maximumPacketSize && (host->receivedData <= peVar7)) &&
        (peVar7 <= host->receivedData + host->receivedDataLength)))) {
      uVar10 = (ulong)((uint)(command->header).channelID * 0x50);
      uVar2 = (command->header).reliableSequenceNumber;
      uVar3 = *(ushort *)((long)peer->channels->reliableWindows + uVar10 + 0x20);
      uVar12 = (uVar2 >> 0xc) + 0x10;
      if (uVar3 <= uVar2) {
        uVar12 = uVar2 >> 0xc;
      }
      if (uVar12 < (ushort)((uVar3 >> 0xc) + 7) && uVar3 >> 0xc <= uVar12) {
        channel = (ENetChannel *)((long)peer->channels->reliableWindows + (uVar10 - 6));
        uVar12 = (command->acknowledge).receivedReliableSequenceNumber << 8 |
                 (command->acknowledge).receivedReliableSequenceNumber >> 8;
        if ((uVar2 != uVar3) || (channel->incomingUnreliableSequenceNumber < uVar12)) {
          uVar13 = (command->connect).mtu;
          uVar5 = (command->connect).windowSize;
          uVar15 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
          uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                   uVar13 << 0x18;
          if (uVar13 <= uVar15 || 0x100000 < uVar13) {
            return -1;
          }
          uVar9 = (command->connect).incomingBandwidth;
          uVar14 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
          uVar9 = (command->connect).channelCount;
          uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
          uVar10 = (ulong)uVar9;
          if (uVar9 - uVar14 < (uint)uVar6) {
            return -1;
          }
          if (uVar9 <= uVar14) {
            return -1;
          }
          if (uVar9 < uVar13) {
            return -1;
          }
          if (host->maximumPacketSize < uVar10) {
            return -1;
          }
          for (pEVar8 = (ENetIncomingCommand *)
                        (channel->incomingUnreliableCommands).sentinel.previous;
              pEVar8 != (ENetIncomingCommand *)&channel->incomingUnreliableCommands;
              pEVar8 = (ENetIncomingCommand *)(pEVar8->incomingCommandList).previous) {
            uVar4 = pEVar8->reliableSequenceNumber;
            if (uVar2 < uVar3) {
              if (uVar3 <= uVar4) break;
LAB_0010890a:
              if (uVar4 < uVar2) break;
              if ((uVar4 <= uVar2) && (pEVar8->unreliableSequenceNumber <= uVar12)) {
                if (uVar12 <= pEVar8->unreliableSequenceNumber) {
                  if (((pEVar8->command).header.command & 0xf) != 0xc) {
                    return -1;
                  }
                  if (pEVar8->packet->dataLength != uVar10) {
                    return -1;
                  }
                  if (uVar13 != pEVar8->fragmentCount) {
                    return -1;
                  }
                  goto LAB_00108944;
                }
                break;
              }
            }
            else if (uVar3 <= uVar4) goto LAB_0010890a;
          }
          pEVar8 = enet_peer_queue_incoming_command(peer,command,(void *)0x0,uVar10,8,uVar13);
          if (pEVar8 == (ENetIncomingCommand *)0x0) {
            return -1;
          }
LAB_00108944:
          uVar15 = uVar15 >> 5;
          if ((pEVar8->fragments[uVar15] >> (uVar5 >> 0x18 & 0x1f) & 1) == 0) {
            pEVar8->fragmentsRemaining = pEVar8->fragmentsRemaining - 1;
            puVar1 = pEVar8->fragments + uVar15;
            *puVar1 = *puVar1 | 1 << ((byte)(uVar5 >> 0x18) & 0x1f);
            uVar10 = pEVar8->packet->dataLength;
            uVar13 = (int)uVar10 - uVar14;
            if (uVar14 + uVar6 <= uVar10) {
              uVar13 = (uint)uVar6;
            }
            memcpy(pEVar8->packet->data + uVar14,&(command->connect).outgoingBandwidth,(ulong)uVar13
                  );
            if (pEVar8->fragmentsRemaining != 0) {
              return 0;
            }
            enet_peer_dispatch_incoming_unreliable_commands(peer,channel,(ENetIncomingCommand *)0x0)
            ;
            return 0;
          }
        }
      }
      iVar11 = 0;
    }
  }
  return iVar11;
}

Assistant:

static int enet_protocol_handle_send_unreliable_fragment(ENetHost *host, ENetPeer *peer, const ENetProtocol *command, enet_uint8 **currentData) {
        enet_uint32 fragmentNumber, fragmentCount, fragmentOffset, fragmentLength, reliableSequenceNumber, startSequenceNumber, totalLength;
        enet_uint16 reliableWindow, currentWindow;
        ENetChannel *channel;
        ENetListIterator currentCommand;
        ENetIncomingCommand *startCommand = NULL;

        if (command->header.channelID >= peer->channelCount || (peer->state != ENET_PEER_STATE_CONNECTED && peer->state != ENET_PEER_STATE_DISCONNECT_LATER)) {
            return -1;
        }

        fragmentLength = ENET_NET_TO_HOST_16(command->sendFragment.dataLength);
        *currentData  += fragmentLength;
        if (fragmentLength <= 0 ||
            fragmentLength > host->maximumPacketSize ||
            *currentData < host->receivedData ||
            *currentData > &host->receivedData[host->receivedDataLength]
        ) {
            return -1;
        }

        channel = &peer->channels[command->header.channelID];
        reliableSequenceNumber = command->header.reliableSequenceNumber;
        startSequenceNumber    = ENET_NET_TO_HOST_16(command->sendFragment.startSequenceNumber);

        reliableWindow = reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
        currentWindow  = channel->incomingReliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

        if (reliableSequenceNumber < channel->incomingReliableSequenceNumber) {
            reliableWindow += ENET_PEER_RELIABLE_WINDOWS;
        }

        if (reliableWindow < currentWindow || reliableWindow >= currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS - 1) {
            return 0;
        }

        if (reliableSequenceNumber == channel->incomingReliableSequenceNumber && startSequenceNumber <= channel->incomingUnreliableSequenceNumber) {
            return 0;
        }

        fragmentNumber = ENET_NET_TO_HOST_32(command->sendFragment.fragmentNumber);
        fragmentCount  = ENET_NET_TO_HOST_32(command->sendFragment.fragmentCount);
        fragmentOffset = ENET_NET_TO_HOST_32(command->sendFragment.fragmentOffset);
        totalLength    = ENET_NET_TO_HOST_32(command->sendFragment.totalLength);

        if (fragmentCount > ENET_PROTOCOL_MAXIMUM_FRAGMENT_COUNT ||
            fragmentNumber >= fragmentCount ||
            totalLength > host->maximumPacketSize ||
            totalLength < fragmentCount ||
            fragmentOffset >= totalLength ||
            fragmentLength > totalLength - fragmentOffset
        ) {
            return -1;
        }

        for (currentCommand = enet_list_previous(enet_list_end(&channel->incomingUnreliableCommands));
            currentCommand != enet_list_end(&channel->incomingUnreliableCommands);
            currentCommand = enet_list_previous(currentCommand)
        ) {
            ENetIncomingCommand *incomingCommand = (ENetIncomingCommand *) currentCommand;

            if (reliableSequenceNumber >= channel->incomingReliableSequenceNumber) {
                if (incomingCommand->reliableSequenceNumber < channel->incomingReliableSequenceNumber) {
                    continue;
                }
            } else if (incomingCommand->reliableSequenceNumber >= channel->incomingReliableSequenceNumber) {
                break;
            }

            if (incomingCommand->reliableSequenceNumber < reliableSequenceNumber) {
                break;
            }

            if (incomingCommand->reliableSequenceNumber > reliableSequenceNumber) {
                continue;
            }

            if (incomingCommand->unreliableSequenceNumber <= startSequenceNumber) {
                if (incomingCommand->unreliableSequenceNumber < startSequenceNumber) {
                    break;
                }

                if ((incomingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK) !=
                    ENET_PROTOCOL_COMMAND_SEND_UNRELIABLE_FRAGMENT ||
                    totalLength != incomingCommand->packet->dataLength ||
                    fragmentCount != incomingCommand->fragmentCount
                ) {
                    return -1;
                }

                startCommand = incomingCommand;
                break;
            }
        }

        if (startCommand == NULL) {
            startCommand = enet_peer_queue_incoming_command(peer, command, NULL, totalLength,
                ENET_PACKET_FLAG_UNRELIABLE_FRAGMENT, fragmentCount);
            if (startCommand == NULL) {
                return -1;
            }
        }

        if ((startCommand->fragments[fragmentNumber / 32] & (1u << (fragmentNumber % 32))) == 0) {
            --startCommand->fragmentsRemaining;
            startCommand->fragments[fragmentNumber / 32] |= (1u << (fragmentNumber % 32));

            if (fragmentOffset + fragmentLength > startCommand->packet->dataLength) {
                fragmentLength = startCommand->packet->dataLength - fragmentOffset;
            }

            memcpy(startCommand->packet->data + fragmentOffset, (enet_uint8 *) command + sizeof(ENetProtocolSendFragment), fragmentLength);

            if (startCommand->fragmentsRemaining <= 0) {
                enet_peer_dispatch_incoming_unreliable_commands(peer, channel, NULL);
            }
        }

        return 0;
    }